

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O2

void inline_x25519_ge_dbl_4(ge_p3_4 *r,ge_p3_4 *p,bool skip_t)

{
  undefined7 in_register_00000011;
  fe4 cY;
  fe4 cX;
  fe4 t0;
  fe4 trX;
  fe4 cT;
  fe4 cZ;
  fe4 trT;
  fe4 trZ;
  uint64_t local_138 [4];
  uint64_t local_118 [4];
  uint64_t local_f8 [4];
  uint64_t local_d8 [4];
  uint64_t local_b8 [4];
  uint64_t local_98 [4];
  uint64_t local_78 [4];
  uint64_t local_58 [5];
  
  fiat_curve25519_adx_square(local_d8);
  fiat_curve25519_adx_square(local_58,p->Y);
  fiat_curve25519_adx_square(local_78,p->Z);
  fe4_add(local_78,local_78,local_78);
  fe4_add(local_138,p->X,p->Y);
  fiat_curve25519_adx_square(local_f8,local_138);
  fe4_add(local_138,local_58,local_d8);
  fe4_sub(local_98,local_58,local_d8);
  fe4_sub(local_118,local_f8,local_138);
  fe4_sub(local_b8,local_78,local_98);
  fiat_curve25519_adx_mul(r,local_118,local_b8);
  fiat_curve25519_adx_mul(r->Y,local_138,local_98);
  fiat_curve25519_adx_mul(r->Z,local_98,local_b8);
  if ((int)CONCAT71(in_register_00000011,skip_t) == 0) {
    fiat_curve25519_adx_mul(r->T,local_118,local_138);
  }
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void inline_x25519_ge_dbl_4(ge_p3_4 *r, const ge_p3_4 *p, bool skip_t) {
  // Transcribed from a Coq function proven against affine coordinates.
  // https://github.com/mit-plv/fiat-crypto/blob/9943ba9e7d8f3e1c0054b2c94a5edca46ea73ef8/src/Curves/Edwards/XYZT/Basic.v#L136-L165
  fe4 trX, trZ, trT, t0, cX, cY, cZ, cT;
  fe4_sq(trX, p->X);
  fe4_sq(trZ, p->Y);
  fe4_sq(trT, p->Z);
  fe4_add(trT, trT, trT);
  fe4_add(cY, p->X, p->Y);
  fe4_sq(t0, cY);
  fe4_add(cY, trZ, trX);
  fe4_sub(cZ, trZ, trX);
  fe4_sub(cX, t0, cY);
  fe4_sub(cT, trT, cZ);
  fe4_mul(r->X, cX, cT);
  fe4_mul(r->Y, cY, cZ);
  fe4_mul(r->Z, cZ, cT);
  if (!skip_t) {
    fe4_mul(r->T, cX, cY);
  }
}